

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int editPage(MemPage *pPg,int iOld,int iNew,int nNew,CellArray *pCArray)

{
  byte bVar1;
  u16 uVar2;
  ushort uVar3;
  int iVar4;
  u8 *pBegin;
  u16 *puVar5;
  u8 *puVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iFirst;
  uint uVar10;
  ulong uVar11;
  u8 *pData;
  u8 *local_48;
  ulong local_40;
  u8 *local_38;
  
  local_38 = pPg->aData;
  local_40 = (ulong)pPg->hdrOffset;
  pBegin = pPg->aCellIdx + nNew * 2;
  uVar3 = pPg->nCell;
  bVar1 = pPg->nOverflow;
  uVar8 = (uint)uVar3;
  uVar10 = uVar8;
  if (iOld < iNew) {
    iVar4 = pageFreeArray(pPg,iOld,iNew - iOld,pCArray);
    uVar10 = uVar8 - iVar4;
    if ((int)uVar8 < iVar4) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112e6,
                  "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
      return 0xb;
    }
    memmove(pPg->aCellIdx,pPg->aCellIdx + iVar4 * 2,(ulong)((uint)uVar3 * 2));
  }
  iVar4 = (uint)uVar3 + iOld + (uint)bVar1;
  iFirst = nNew + iNew;
  iVar9 = iVar4 - iFirst;
  if (iVar9 != 0 && iFirst <= iVar4) {
    iVar4 = pageFreeArray(pPg,iFirst,iVar9,pCArray);
    uVar10 = uVar10 - iVar4;
  }
  local_48 = local_38 +
             (ulong)((ushort)(*(ushort *)(local_38 + local_40 + 5) << 8 |
                             *(ushort *)(local_38 + local_40 + 5) >> 8) - 1 & 0xffff) + 1;
  if (pBegin <= local_48) {
    if (iNew < iOld) {
      iVar4 = iOld - iNew;
      if (nNew <= iOld - iNew) {
        iVar4 = nNew;
      }
      puVar6 = pPg->aCellIdx;
      memmove(puVar6 + iVar4 * 2,puVar6,(long)(int)(uVar10 * 2));
      iVar9 = pageInsertArray(pPg,pBegin,&local_48,puVar6,iNew,iVar4,pCArray);
      if (iVar9 != 0) goto LAB_0017af56;
      uVar10 = uVar10 + iVar4;
    }
    bVar1 = pPg->nOverflow;
    if (bVar1 != 0) {
      uVar11 = 0;
      do {
        iVar9 = (uint)pPg->aiOvfl[uVar11] + iOld;
        iVar4 = iVar9 - iNew;
        if (iVar4 < nNew && -1 < iVar4) {
          puVar6 = pPg->aCellIdx + (uint)(iVar4 * 2);
          if (uVar10 - iVar4 != 0 && iVar4 <= (int)uVar10) {
            memmove(puVar6 + 2,puVar6,(long)(int)((uVar10 - iVar4) * 2));
          }
          iVar4 = pageInsertArray(pPg,pBegin,&local_48,puVar6,iVar9,1,pCArray);
          if (iVar4 != 0) goto LAB_0017af56;
          uVar10 = uVar10 + 1;
          bVar1 = pPg->nOverflow;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < bVar1);
    }
    iVar4 = pageInsertArray(pPg,pBegin,&local_48,pPg->aCellIdx + (int)(uVar10 * 2),uVar10 + iNew,
                            nNew - uVar10,pCArray);
    if (iVar4 == 0) {
      pPg->nCell = (u16)nNew;
      pPg->nOverflow = '\0';
      local_38[local_40 + 3] = (u8)((uint)nNew >> 8);
      local_38[local_40 + 4] = (u8)pPg->nCell;
      uVar3 = (short)local_48 - (short)local_38;
      *(ushort *)(local_38 + local_40 + 5) = uVar3 * 0x100 | uVar3 >> 8;
      return 0;
    }
  }
LAB_0017af56:
  if (0 < nNew) {
    puVar5 = pCArray->szCell;
    lVar7 = (long)iNew * 2;
    iVar4 = nNew + 1;
    do {
      if (*(short *)((long)puVar5 + lVar7) == 0) {
        uVar2 = (*pCArray->pRef->xCellSize)
                          (pCArray->pRef,*(u8 **)((long)pCArray->apCell + lVar7 * 4));
        puVar5 = pCArray->szCell;
        *(u16 *)((long)puVar5 + lVar7) = uVar2;
      }
      lVar7 = lVar7 + 2;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  iVar4 = rebuildPage(pCArray,iNew,nNew,pPg);
  return iVar4;
}

Assistant:

static int editPage(
  MemPage *pPg,                   /* Edit this page */
  int iOld,                       /* Index of first cell currently on page */
  int iNew,                       /* Index of new first cell on page */
  int nNew,                       /* Final number of cells on page */
  CellArray *pCArray              /* Array of cells and sizes */
){
  u8 * const aData = pPg->aData;
  const int hdr = pPg->hdrOffset;
  u8 *pBegin = &pPg->aCellIdx[nNew * 2];
  int nCell = pPg->nCell;       /* Cells stored on pPg */
  u8 *pData;
  u8 *pCellptr;
  int i;
  int iOldEnd = iOld + pPg->nCell + pPg->nOverflow;
  int iNewEnd = iNew + nNew;

#ifdef SQLITE_DEBUG
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  memcpy(pTmp, aData, pPg->pBt->usableSize);
#endif

  /* Remove cells from the start and end of the page */
  assert( nCell>=0 );
  if( iOld<iNew ){
    int nShift = pageFreeArray(pPg, iOld, iNew-iOld, pCArray);
    if( nShift>nCell ) return SQLITE_CORRUPT_BKPT;
    memmove(pPg->aCellIdx, &pPg->aCellIdx[nShift*2], nCell*2);
    nCell -= nShift;
  }
  if( iNewEnd < iOldEnd ){
    int nTail = pageFreeArray(pPg, iNewEnd, iOldEnd - iNewEnd, pCArray);
    assert( nCell>=nTail );
    nCell -= nTail;
  }

  pData = &aData[get2byteNotZero(&aData[hdr+5])];
  if( pData<pBegin ) goto editpage_fail;

  /* Add cells to the start of the page */
  if( iNew<iOld ){
    int nAdd = MIN(nNew,iOld-iNew);
    assert( (iOld-iNew)<nNew || nCell==0 || CORRUPT_DB );
    assert( nAdd>=0 );
    pCellptr = pPg->aCellIdx;
    memmove(&pCellptr[nAdd*2], pCellptr, nCell*2);
    if( pageInsertArray(
          pPg, pBegin, &pData, pCellptr,
          iNew, nAdd, pCArray
    ) ) goto editpage_fail;
    nCell += nAdd;
  }

  /* Add any overflow cells */
  for(i=0; i<pPg->nOverflow; i++){
    int iCell = (iOld + pPg->aiOvfl[i]) - iNew;
    if( iCell>=0 && iCell<nNew ){
      pCellptr = &pPg->aCellIdx[iCell * 2];
      if( nCell>iCell ){
        memmove(&pCellptr[2], pCellptr, (nCell - iCell) * 2);
      }
      nCell++;
      if( pageInsertArray(
            pPg, pBegin, &pData, pCellptr,
            iCell+iNew, 1, pCArray
      ) ) goto editpage_fail;
    }
  }

  /* Append cells to the end of the page */
  assert( nCell>=0 );
  pCellptr = &pPg->aCellIdx[nCell*2];
  if( pageInsertArray(
        pPg, pBegin, &pData, pCellptr,
        iNew+nCell, nNew-nCell, pCArray
  ) ) goto editpage_fail;

  pPg->nCell = nNew;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);

#ifdef SQLITE_DEBUG
  for(i=0; i<nNew && !CORRUPT_DB; i++){
    u8 *pCell = pCArray->apCell[i+iNew];
    int iOff = get2byteAligned(&pPg->aCellIdx[i*2]);
    if( SQLITE_WITHIN(pCell, aData, &aData[pPg->pBt->usableSize]) ){
      pCell = &pTmp[pCell - aData];
    }
    assert( 0==memcmp(pCell, &aData[iOff],
            pCArray->pRef->xCellSize(pCArray->pRef, pCArray->apCell[i+iNew])) );
  }
#endif

  return SQLITE_OK;
 editpage_fail:
  /* Unable to edit this page. Rebuild it from scratch instead. */
  populateCellCache(pCArray, iNew, nNew);
  return rebuildPage(pCArray, iNew, nNew, pPg);
}